

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
nonsugar::
basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<>>
::argument<(char)100,std::__cxx11::string>
          (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *placeholder)

{
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RCX;
  tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_61;
  undefined1 local_60 [8];
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *placeholder_local;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<>_>
  *this_local;
  
  a.read._M_invoker = (_Invoker_type)placeholder;
  std::__cxx11::string::string((string *)local_60,(string *)placeholder);
  std::function<std::shared_ptr<std::__cxx11::string>(std::__cxx11::string_const&)>::
  function<nonsugar::value_read<std::__cxx11::string,std::__cxx11::string,void>,void>
            ((function<std::shared_ptr<std::__cxx11::string>(std::__cxx11::string_const&)> *)
             (a.placeholder.field_2._M_local_buf + 8),&local_61);
  detail::
  tuple_append<std::tuple<>,nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>
            (&local_a8,(detail *)((long)this + 0x191),(tuple<> *)local_60,in_RCX);
  detail::
  make_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>
            (__return_storage_ptr__,(detail *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)this + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)this + 0x40),
             (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>
              *)((long)this + 400),(tuple<> *)&local_a8,in_stack_ffffffffffffff08);
  std::
  tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'d',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~tuple(&local_a8);
  detail::
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'d',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~argument((argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_60);
  return __return_storage_ptr__;
}

Assistant:

auto argument(String const &placeholder) const
    {
        detail::argument<String, OptionType, Option, Value> a {
            placeholder, value_read<String, typename detail::value_of<String, Value>::type>() };
        return detail::make_command<String, OptionType>(
            m_header, m_footer, m_flags, m_subcommands,
            detail::tuple_append(m_arguments, std::move(a)));
    }